

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

FILE * getiofile(lua_State *L,int findex)

{
  FILE *pFVar1;
  long *plVar2;
  FILE *f;
  int findex_local;
  lua_State *L_local;
  
  lua_rawgeti(L,-0x2711,findex);
  plVar2 = (long *)lua_touserdata(L,-1);
  pFVar1 = (FILE *)*plVar2;
  if (pFVar1 == (FILE *)0x0) {
    luaL_error(L,"standard %s file is closed",fnames[findex + -1]);
  }
  return pFVar1;
}

Assistant:

static FILE*getiofile(lua_State*L,int findex){
FILE*f;
lua_rawgeti(L,(-10001),findex);
f=*(FILE**)lua_touserdata(L,-1);
if(f==NULL)
luaL_error(L,"standard %s file is closed",fnames[findex-1]);
return f;
}